

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableSettingsAddSettingsHandler(void)

{
  ImGuiID IVar1;
  ImGuiSettingsHandler ini_handler;
  undefined4 in_stack_ffffffffffffffc4;
  
  ImGuiSettingsHandler::ImGuiSettingsHandler((ImGuiSettingsHandler *)0x24a64c);
  IVar1 = ImHashStr("Table",0,0);
  AddSettingsHandler((ImGuiSettingsHandler *)CONCAT44(in_stack_ffffffffffffffc4,IVar1));
  return;
}

Assistant:

void ImGui::TableSettingsAddSettingsHandler()
{
    ImGuiSettingsHandler ini_handler;
    ini_handler.TypeName = "Table";
    ini_handler.TypeHash = ImHashStr("Table");
    ini_handler.ClearAllFn = TableSettingsHandler_ClearAll;
    ini_handler.ReadOpenFn = TableSettingsHandler_ReadOpen;
    ini_handler.ReadLineFn = TableSettingsHandler_ReadLine;
    ini_handler.ApplyAllFn = TableSettingsHandler_ApplyAll;
    ini_handler.WriteAllFn = TableSettingsHandler_WriteAll;
    AddSettingsHandler(&ini_handler);
}